

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

MemoryRegionSection * iotlb_to_section_x86_64(CPUState *cpu,hwaddr index,MemTxAttrs attrs)

{
  uint uVar1;
  
  uVar1 = cpu_asidx_from_attrs(cpu,attrs);
  return (MemoryRegionSection *)
         ((long)&(((cpu->cpu_ases[uVar1].memory_dispatch)->map).sections)->size +
         (ulong)(((uint)index & 0xfff) << 6));
}

Assistant:

MemoryRegionSection *iotlb_to_section(CPUState *cpu,
                                      hwaddr index, MemTxAttrs attrs)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif
    int asidx = cpu_asidx_from_attrs(cpu, attrs);
    CPUAddressSpace *cpuas = &cpu->cpu_ases[asidx];
    AddressSpaceDispatch *d = cpuas->memory_dispatch;
    MemoryRegionSection *sections = d->map.sections;

    return &sections[index & ~TARGET_PAGE_MASK];
}